

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

void Png::handleError(png_structp png,char *msg)

{
  char *pcVar1;
  string local_40;
  Png *local_20;
  Png *self;
  char *msg_local;
  png_structp png_local;
  
  self = (Png *)msg;
  msg_local = (char *)png;
  local_20 = (Png *)png_get_error_ptr(png);
  string_abi_cxx11_(&local_40,local_20);
  pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&local_40);
  fatal("Error reading input image (\"%s\"): %s",pcVar1,self);
}

Assistant:

[[noreturn]] static void handleError(png_structp png, char const *msg) {
		Png *self = reinterpret_cast<Png *>(png_get_error_ptr(png));

		fatal("Error reading input image (\"%s\"): %s", self->string().c_str(), msg);
	}